

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Gia_DeriveFormula_rec(Gia_Man_t *pGia,char **ppNamesIn,Vec_Str_t *vStr,int iLit)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  char **format;
  size_t sVar8;
  char cVar9;
  char **__size;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (pGia->nObjs <= (int)((uint)iLit >> 1)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar1 = pGia->pObjs + ((uint)iLit >> 1);
  uVar7 = iLit & 1;
  if ((~*(uint *)pGVar1 & 0x1fffffff) == 0 || (int)*(uint *)pGVar1 < 0) {
    format = ppNamesIn;
    if (uVar7 == 0) goto LAB_00589b59;
    uVar7 = vStr->nCap;
    if (vStr->nSize == uVar7) {
      if ((int)uVar7 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          format = (char **)&DAT_00000010;
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar4;
        __size = (char **)&DAT_00000010;
      }
      else {
        __size = (char **)((ulong)uVar7 * 2);
        if ((int)__size <= (int)uVar7) goto LAB_00589b47;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc((size_t)__size);
        }
        else {
          format = __size;
          pcVar4 = (char *)realloc(vStr->pArray,(size_t)__size);
        }
        vStr->pArray = pcVar4;
      }
      vStr->nCap = (int)__size;
    }
LAB_00589b47:
    iVar3 = vStr->nSize;
    vStr->nSize = iVar3 + 1;
    vStr->pArray[iVar3] = '~';
LAB_00589b59:
    if ((int)*(undefined8 *)pGVar1 < 0) {
      Vec_StrPrintF(vStr,(char *)format,
                    *(undefined8 *)
                     ((long)ppNamesIn +
                     (ulong)(uint)((int)((ulong)*(undefined8 *)pGVar1 >> 0x20) << 3)));
      return;
    }
    __assert_fail("pObj->fTerm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
  }
  uVar5 = vStr->nCap;
  if (vStr->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar4;
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar5 * 2;
      if ((int)sVar8 <= (int)uVar5) goto LAB_00589707;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar8);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar8);
      }
      vStr->pArray = pcVar4;
    }
    vStr->nCap = (int)sVar8;
  }
LAB_00589707:
  iVar3 = vStr->nSize;
  vStr->nSize = iVar3 + 1;
  vStr->pArray[iVar3] = '(';
  pGVar2 = pGia->pObjs;
  if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_00589ba2;
  if ((pGia->pMuxes == (uint *)0x0) ||
     (iVar3 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2),
     pGia->pMuxes[iVar3 * -0x55555555] == 0)) {
    iVar3 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 -
            (*(uint *)pGVar1 & 0x1fffffff);
    if (iVar3 < 0) goto LAB_00589bff;
    Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)pGVar1 >> 0x1d & 1) + iVar3 * 2 ^ uVar7);
    uVar5 = (uint)*(undefined8 *)pGVar1;
    cVar6 = '|';
    if (uVar7 == 0) {
      cVar6 = '&';
    }
    cVar9 = '^';
    if (((~uVar5 & 0x1fffffff) == 0 || (int)uVar5 < 0) ||
        ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) <= (uVar5 & 0x1fffffff)) {
      cVar9 = cVar6;
    }
    uVar5 = vStr->nCap;
    if (vStr->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar8 = 0x10;
      }
      else {
        sVar8 = (ulong)uVar5 * 2;
        if ((int)sVar8 <= (int)uVar5) goto LAB_005898d3;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar8);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,sVar8);
        }
      }
      vStr->pArray = pcVar4;
      vStr->nCap = (int)sVar8;
    }
LAB_005898d3:
    iVar3 = vStr->nSize;
    vStr->nSize = iVar3 + 1;
    vStr->pArray[iVar3] = cVar9;
    pGVar2 = pGia->pObjs;
    if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_00589ba2;
    uVar5 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
    iVar3 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 - (uVar5 & 0x1fffffff);
    if (iVar3 < 0) goto LAB_00589bff;
    uVar5 = (uVar5 >> 0x1d & 1) + iVar3 * 2;
  }
  else {
    iVar3 = iVar3 * -0x55555555 - (*(uint *)pGVar1 & 0x1fffffff);
    if (iVar3 < 0) goto LAB_00589bff;
    Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)pGVar1 >> 0x1d & 1) + iVar3 * 2);
    uVar5 = vStr->nCap;
    if (vStr->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar8 = 0x10;
      }
      else {
        sVar8 = (ulong)uVar5 * 2;
        if ((int)sVar8 <= (int)uVar5) goto LAB_0058995a;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar8);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,sVar8);
        }
      }
      vStr->pArray = pcVar4;
      vStr->nCap = (int)sVar8;
    }
LAB_0058995a:
    iVar3 = vStr->nSize;
    vStr->nSize = iVar3 + 1;
    vStr->pArray[iVar3] = '?';
    pGVar2 = pGia->pObjs;
    if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_00589ba2;
    uVar5 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
    iVar3 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 - (uVar5 & 0x1fffffff);
    if (iVar3 < 0) {
LAB_00589bff:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(uVar5 >> 0x1d & 1) + iVar3 * 2 ^ uVar7);
    uVar5 = vStr->nCap;
    if (vStr->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar8 = 0x10;
      }
      else {
        sVar8 = (ulong)uVar5 * 2;
        if ((int)sVar8 <= (int)uVar5) goto LAB_00589a2e;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar8);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,sVar8);
        }
      }
      vStr->pArray = pcVar4;
      vStr->nCap = (int)sVar8;
    }
LAB_00589a2e:
    iVar3 = vStr->nSize;
    vStr->nSize = iVar3 + 1;
    vStr->pArray[iVar3] = ':';
    if (pGia->pMuxes == (uint *)0x0) {
      uVar5 = 0xffffffff;
    }
    else {
      pGVar2 = pGia->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) {
LAB_00589ba2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar5 = pGia->pMuxes[(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555];
      uVar5 = -(uint)(uVar5 == 0) | uVar5;
    }
    if ((int)uVar5 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
  }
  Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,uVar5 ^ uVar7);
  uVar7 = vStr->nCap;
  if (vStr->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar7 * 2;
      if ((int)sVar8 <= (int)uVar7) goto LAB_00589b00;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar8);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar8;
  }
LAB_00589b00:
  iVar3 = vStr->nSize;
  vStr->nSize = iVar3 + 1;
  vStr->pArray[iVar3] = ')';
  return;
}

Assistant:

void Gia_DeriveFormula_rec( Gia_Man_t * pGia, char ** ppNamesIn, Vec_Str_t * vStr, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, Abc_Lit2Var(iLit) );
    int fCompl = Abc_LitIsCompl(iLit);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_StrPush( vStr, '(' );
        if ( Gia_ObjIsMux(pGia, pObj) )
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
            Vec_StrPush( vStr, '?' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, ':' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit2p(pGia, pObj), fCompl ) );
        }
        else
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit0p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, (char)(Gia_ObjIsXor(pObj) ? '^' : (char)(fCompl ? '|' : '&')) );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
        }
        Vec_StrPush( vStr, ')' );
    }
    else
    {
        if ( fCompl ) Vec_StrPush( vStr, '~' );
        Vec_StrPrintF( vStr, "%s", ppNamesIn[Gia_ObjCioId(pObj)] );
    }
}